

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void Service_FindServers(UA_Server *server,UA_Session *session,UA_FindServersRequest *request,
                        UA_FindServersResponse *response)

{
  size_t sVar1;
  size_t sVar2;
  UA_StatusCode UVar3;
  UA_ApplicationDescription *dst;
  UA_String *pUVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  dst = (UA_ApplicationDescription *)malloc(0x78);
  if (dst == (UA_ApplicationDescription *)0x0) {
    (response->responseHeader).serviceResult = 0x80030000;
    return;
  }
  UVar3 = UA_copy(&(server->config).applicationDescription,dst,UA_TYPES + 0x8f);
  (response->responseHeader).serviceResult = UVar3;
  if (UVar3 == 0) {
    pUVar4 = (UA_String *)
             realloc(dst->discoveryUrls,
                     ((server->config).networkLayersSize + dst->discoveryUrlsSize) * 0x10);
    if (pUVar4 != (UA_String *)0x0) {
      sVar1 = dst->discoveryUrlsSize;
      dst->discoveryUrls = pUVar4;
      sVar2 = (server->config).networkLayersSize;
      dst->discoveryUrlsSize = sVar2 + sVar1;
      if (sVar2 != 0) {
        lVar6 = sVar1 << 4;
        lVar7 = 8;
        uVar5 = 0;
        do {
          UA_copy((void *)((long)&((server->config).networkLayers)->handle + lVar7),
                  (void *)((long)&dst->discoveryUrls->length + lVar6),UA_TYPES + 0xb);
          uVar5 = uVar5 + 1;
          lVar7 = lVar7 + 0x38;
          lVar6 = lVar6 + 0x10;
        } while (uVar5 < (server->config).networkLayersSize);
      }
      response->servers = dst;
      response->serversSize = 1;
      return;
    }
    (response->responseHeader).serviceResult = 0x80030000;
    deleteMembers_noInit(dst,UA_TYPES + 0x8f);
  }
  free(dst);
  return;
}

Assistant:

void Service_FindServers(UA_Server *server, UA_Session *session,
                         const UA_FindServersRequest *request, UA_FindServersResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing FindServersRequest");
    /* copy ApplicationDescription from the config */
    UA_ApplicationDescription *descr = UA_malloc(sizeof(UA_ApplicationDescription));
    if(!descr) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->responseHeader.serviceResult =
        UA_ApplicationDescription_copy(&server->config.applicationDescription, descr);
    if(response->responseHeader.serviceResult != UA_STATUSCODE_GOOD) {
        UA_free(descr);
        return;
    }

    /* add the discoveryUrls from the networklayers */
    UA_String *disc = UA_realloc(descr->discoveryUrls, sizeof(UA_String) *
                                 (descr->discoveryUrlsSize + server->config.networkLayersSize));
    if(!disc) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        UA_ApplicationDescription_delete(descr);
        return;
    }
    size_t existing = descr->discoveryUrlsSize;
    descr->discoveryUrls = disc;
    descr->discoveryUrlsSize += server->config.networkLayersSize;

    // TODO: Add nl only if discoveryUrl not already present
    for(size_t i = 0; i < server->config.networkLayersSize; ++i) {
        UA_ServerNetworkLayer *nl = &server->config.networkLayers[i];
        UA_String_copy(&nl->discoveryUrl, &descr->discoveryUrls[existing + i]);
    }

    response->servers = descr;
    response->serversSize = 1;
}